

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

int cueify_device_read_cdtext_unportable(cueify_device_private *d,cueify_cdtext_private *t)

{
  int iVar1;
  cdrom_generic_command gpcmd;
  request_sense sense;
  uint8_t data [36868];
  
  iVar1 = ioctl(d->handle,0x5393);
  if (iVar1 < 0) {
    iVar1 = 2;
  }
  else {
    iVar1 = cueify_cdtext_deserialize((cueify_cdtext *)t,data,0x9004);
  }
  return iVar1;
}

Assistant:

int cueify_device_read_cdtext_unportable(cueify_device_private *d,
					 cueify_cdtext_private *t) {
    struct cdrom_generic_command gpcmd;
    struct scsi_read_toc *scsi_cmd;
    struct request_sense sense;
    /* At most 2048 descriptors at 18 bytes a piece, plus 4 bytes header. */
    uint8_t data[2048 * 18 + 4];

    memset(&gpcmd, 0, sizeof(gpcmd));

    scsi_cmd = (struct scsi_read_toc *)&gpcmd.cmd;
    scsi_cmd->format |= 0x05;  /* 0101b = CD-TEXT */
    scsi_cmd->data_len[0] = (sizeof(data) >> 8) & 0xFF;
    scsi_cmd->data_len[1] = sizeof(data) & 0xFF;
    scsi_cmd->op_code = GPCMD_READ_TOC_PMA_ATIP;

    gpcmd.buffer = data;
    gpcmd.buflen = sizeof(data);
    gpcmd.sense = &sense;
    gpcmd.data_direction = CGC_DATA_READ;
    gpcmd.timeout = 50000;

    if (ioctl(d->handle, CDROM_SEND_PACKET, &gpcmd) < 0) {
	return CUEIFY_ERR_INTERNAL;
    }

    /* We serialize to the format of the TOC response for a reason... */
    return cueify_cdtext_deserialize((cueify_cdtext *)t,
				     data, sizeof(data));
}